

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

int __thiscall deqp::gles31::bb::BufferLayout::getBlockIndex(BufferLayout *this,string *name)

{
  pointer pBVar1;
  __type_conflict _Var2;
  long lVar3;
  int ndx;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    pBVar1 = (this->blocks).
             super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->blocks).
                            super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 6) <=
        lVar4) {
      return -1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pBVar1->name)._M_dataplus + lVar3),name);
    if (_Var2) break;
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x40;
  }
  return (int)lVar4;
}

Assistant:

int BufferLayout::getBlockIndex (const string& name) const
{
	for (int ndx = 0; ndx < (int)blocks.size(); ndx++)
	{
		if (blocks[ndx].name == name)
			return ndx;
	}
	return -1;
}